

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O1

void deqp::gles3::Functional::createRandomCaseGroup
               (TestCaseGroup *parentGroup,Context *context,char *groupName,char *description,
               BufferMode bufferMode,deUint32 features,int numCases,deUint32 baseSeed)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  int iVar1;
  TestNode *node;
  RandomUniformBlockCase *this;
  int iVar2;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,groupName,description);
  tcu::TestNode::addChild(&parentGroup->super_TestNode,node);
  iVar1 = tcu::CommandLine::getBaseSeed(context->m_testCtx->m_cmdLine);
  if (0 < numCases) {
    iVar2 = 0;
    do {
      this = (RandomUniformBlockCase *)operator_new(0xe8);
      testCtx = context->m_testCtx;
      renderCtx = context->m_renderCtx;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      deqp::gls::RandomUniformBlockCase::RandomUniformBlockCase
                (this,testCtx,renderCtx,GLSL_VERSION_300_ES,(char *)local_1c8,
                 glcts::fixed_sample_locations_values + 1,bufferMode,features,
                 iVar1 + baseSeed + iVar2);
      tcu::TestNode::addChild(node,(TestNode *)this);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      iVar2 = iVar2 + 1;
    } while (numCases != iVar2);
  }
  return;
}

Assistant:

static void createRandomCaseGroup (tcu::TestCaseGroup* parentGroup, Context& context, const char* groupName, const char* description, UniformBlockCase::BufferMode bufferMode, deUint32 features, int numCases, deUint32 baseSeed)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(context.getTestContext(), groupName, description);
	parentGroup->addChild(group);

	baseSeed += (deUint32)context.getTestContext().getCommandLine().getBaseSeed();

	for (int ndx = 0; ndx < numCases; ndx++)
		group->addChild(new RandomUniformBlockCase(context.getTestContext(), context.getRenderContext(), glu::GLSL_VERSION_300_ES,
												   de::toString(ndx).c_str(), "", bufferMode, features, (deUint32)ndx+baseSeed));
}